

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_object_clear(JSON_Object *object)

{
  ulong uVar1;
  
  if (object != (JSON_Object *)0x0) {
    for (uVar1 = 0; uVar1 < object->count; uVar1 = uVar1 + 1) {
      (*parson_free)(object->names[uVar1]);
      object->names[uVar1] = (char *)0x0;
      json_value_free(object->values[uVar1]);
      object->values[uVar1] = (JSON_Value *)0x0;
    }
    object->count = 0;
    for (uVar1 = 0; uVar1 < object->cell_capacity; uVar1 = uVar1 + 1) {
      object->cells[uVar1] = 0xffffffffffffffff;
    }
    return 0;
  }
  return -1;
}

Assistant:

JSON_Status json_object_clear(JSON_Object *object) {
    size_t i = 0;
    if (object == NULL) {
        return JSONFailure;
    }
    for (i = 0; i < json_object_get_count(object); i++) {
        parson_free(object->names[i]);
        object->names[i] = NULL;
        
        json_value_free(object->values[i]);
        object->values[i] = NULL;
    }
    object->count = 0;
    for (i = 0; i < object->cell_capacity; i++) {
        object->cells[i] = OBJECT_INVALID_IX;
    }
    return JSONSuccess;
}